

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)401>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint32 uVar4;
  uint uVar5;
  bool bVar6;
  SupportVectorClassifier *pSVar7;
  long lVar8;
  int *piVar9;
  long *plVar10;
  Type *pTVar11;
  undefined8 *puVar12;
  uint uVar13;
  ulong *puVar14;
  size_type *psVar15;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  ulong uVar16;
  int iVar17;
  int iVar18;
  Kernel *kernel;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  undefined1 in_R9B;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ModelDescription *pMVar25;
  string *this;
  string __str;
  Result result;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  uint local_34;
  
  pMVar25 = format->description_;
  if (pMVar25 == (ModelDescription *)0x0) {
    pMVar25 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_80);
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_110,(CoreML *)&pMVar25->input_,features);
  this = (string *)&local_78;
  local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_110;
  std::__cxx11::string::operator=(this,(string *)&local_108);
  pcVar2 = local_100 + 8;
  if (local_108._M_p != pcVar2) {
    operator_delete(local_108._M_p,local_100._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_80);
  if (bVar6) {
    if (format->_oneof_case_[0] == 0x191) {
      pSVar7 = (SupportVectorClassifier *)(format->Type_).pipelineclassifier_;
    }
    else {
      pSVar7 = Specification::SupportVectorClassifier::default_instance();
    }
    validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::SupportVectorClassifier>
              ((Result *)local_110,(CoreML *)format,(Model *)pSVar7,(SupportVectorClassifier *)0x0,
               false,(bool)in_R9B);
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_110;
    std::__cxx11::string::operator=(this,(string *)&local_108);
    if (local_108._M_p != pcVar2) {
      operator_delete(local_108._M_p,local_100._8_8_ + 1);
    }
    bVar6 = Result::good((Result *)&local_80);
    if (bVar6) {
      if (format->_oneof_case_[0] == 0x191) {
        pSVar7 = (format->Type_).supportvectorclassifier_;
      }
      else {
        pSVar7 = Specification::SupportVectorClassifier::default_instance();
      }
      kernel = pSVar7->kernel_;
      if (kernel == (Kernel *)0x0) {
        kernel = (Kernel *)&Specification::_Kernel_default_instance_;
      }
      validateKernel((Result *)local_110,kernel);
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_110;
      std::__cxx11::string::operator=(this,(string *)&local_108);
      if (local_108._M_p != pcVar2) {
        operator_delete(local_108._M_p,local_100._8_8_ + 1);
      }
      bVar6 = Result::good((Result *)&local_80);
      if (bVar6) {
        uVar4 = pSVar7->_oneof_case_[1];
        if (uVar4 == 0) {
          local_110 = (undefined1  [8])local_100;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"Int64 class labels must be supplied for SVM classifier.",
                     "");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
LAB_00298a62:
          local_58.field_2._M_allocated_capacity = local_100._0_8_;
          _Var20._M_p = (pointer)local_110;
          if (local_110 == (undefined1  [8])local_100) goto LAB_00298e67;
        }
        else {
          if (uVar4 == 0x65) {
            lVar8 = 0x10;
LAB_0029891e:
            this = (string *)
                   (ulong)*(uint *)((long)&(((pSVar7->ClassLabels_).stringclasslabels_)->
                                           super_MessageLite)._vptr_MessageLite + lVar8);
          }
          else if (uVar4 == 100) {
            lVar8 = 0x18;
            goto LAB_0029891e;
          }
          uVar23 = (pSVar7->coefficients_).super_RepeatedPtrFieldBase.current_size_;
          iVar18 = (int)this;
          uVar21 = iVar18 - 1;
          if (uVar23 == uVar21) {
            if (1 < pSVar7->_oneof_case_[0] - 3) {
              local_110 = (undefined1  [8])local_100;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_110,"Must specify sparse or dense support vectors","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
              goto LAB_00298a62;
            }
            if ((pSVar7->numberofsupportvectorsperclass_).current_size_ == iVar18) {
              local_c4 = (((pSVar7->supportVectors_).sparsesupportvectors_)->vectors_).
                         super_RepeatedPtrFieldBase.current_size_;
              local_34 = uVar23;
              if (iVar18 < 1) {
                iVar22 = 0;
              }
              else {
                iVar17 = 0;
                iVar22 = 0;
                do {
                  piVar9 = google::protobuf::RepeatedField<int>::Get
                                     (&pSVar7->numberofsupportvectorsperclass_,iVar17);
                  iVar22 = iVar22 + *piVar9;
                  iVar17 = iVar17 + 1;
                } while (iVar18 != iVar17);
              }
              if (local_c4 == iVar22) {
                if (1 < iVar18) {
                  uVar23 = 0;
                  do {
                    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                                        (&(pSVar7->coefficients_).super_RepeatedPtrFieldBase,uVar23)
                    ;
                    if ((pTVar11->alpha_).current_size_ != local_c4) {
                      std::__cxx11::to_string(&local_58,local_c4);
                      std::operator+(&local_a0,"Incorrect number of coefficients: There should be ",
                                     &local_58);
                      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      puVar14 = puVar12 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar12 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)puVar14) {
                        local_e8.field_2._M_allocated_capacity = *puVar14;
                        local_e8.field_2._8_8_ = puVar12[3];
                      }
                      else {
                        local_e8.field_2._M_allocated_capacity = *puVar14;
                        local_e8._M_dataplus._M_p = (pointer)*puVar12;
                      }
                      local_e8._M_string_length = puVar12[1];
                      *puVar12 = puVar14;
                      puVar12[1] = 0;
                      *(undefined1 *)(puVar12 + 2) = 0;
                      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                                          (&(pSVar7->coefficients_).super_RepeatedPtrFieldBase,
                                           uVar23);
                      std::__cxx11::to_string(&local_c0,(pTVar11->alpha_).current_size_);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_110,&local_e8,&local_c0);
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                     (string *)local_110);
                      goto LAB_00299132;
                    }
                    uVar23 = uVar23 + 1;
                  } while (local_34 != uVar23);
                }
                iVar22 = (pSVar7->proba_).current_size_;
                iVar17 = (pSVar7->probb_).current_size_;
                if (iVar22 == 0 && iVar17 == 0) goto LAB_00298e07;
                if (iVar22 != iVar17) {
                  local_110 = (undefined1  [8])local_100;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_110,"probA and probB must be same size","");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110
                                );
                  goto LAB_00298a62;
                }
                iVar18 = (int)(local_34 * iVar18) / 2;
                if (iVar22 == iVar18) goto LAB_00298e07;
                std::__cxx11::to_string(&local_e8,iVar18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_110,"Expected length of probA is number of class pairs: ",
                               &local_e8);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
                if (local_110 != (undefined1  [8])local_100) {
                  operator_delete((void *)local_110,local_100._0_8_ + 1);
                }
                local_58.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
                _Var20._M_p = local_e8._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_00298e67;
                goto LAB_002991bd;
              }
              std::__cxx11::to_string(&local_58,iVar22);
              std::operator+(&local_a0,"sum of numberOfSupportVectorsPerClass ",&local_58);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              puVar14 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar14) {
                local_e8.field_2._M_allocated_capacity = *puVar14;
                local_e8.field_2._8_8_ = puVar12[3];
              }
              else {
                local_e8.field_2._M_allocated_capacity = *puVar14;
                local_e8._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_e8._M_string_length = puVar12[1];
              *puVar12 = puVar14;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string(&local_c0,local_c4);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_110,&local_e8,&local_c0);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
            }
            else {
              std::__cxx11::to_string(&local_58,iVar18);
              std::operator+(&local_a0,
                             "numberOfSupportVectoresPerClass array must be size numberOfClasses ",
                             &local_58);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              puVar14 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar14) {
                local_e8.field_2._M_allocated_capacity = *puVar14;
                local_e8.field_2._8_8_ = puVar12[3];
              }
              else {
                local_e8.field_2._M_allocated_capacity = *puVar14;
                local_e8._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_e8._M_string_length = puVar12[1];
              *puVar12 = puVar14;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string
                        (&local_c0,(pSVar7->numberofsupportvectorsperclass_).current_size_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_110,&local_e8,&local_c0);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
            }
LAB_00299132:
            if (local_110 != (undefined1  [8])local_100) {
              operator_delete((void *)local_110,local_100._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            _Var20._M_p = local_58._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00298e67;
          }
          else {
            uVar23 = -uVar21;
            if (0 < (int)uVar21) {
              uVar23 = uVar21;
            }
            uVar24 = 1;
            if (9 < uVar23) {
              uVar16 = (ulong)uVar23;
              uVar5 = 4;
              do {
                uVar24 = uVar5;
                uVar13 = (uint)uVar16;
                if (uVar13 < 100) {
                  uVar24 = uVar24 - 2;
                  goto LAB_00298aeb;
                }
                if (uVar13 < 1000) {
                  uVar24 = uVar24 - 1;
                  goto LAB_00298aeb;
                }
                if (uVar13 < 10000) goto LAB_00298aeb;
                uVar16 = uVar16 / 10000;
                uVar5 = uVar24 + 4;
              } while (99999 < uVar13);
              uVar24 = uVar24 + 1;
            }
LAB_00298aeb:
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_58,(char)uVar24 - (char)((int)uVar21 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_58._M_dataplus._M_p + (uVar21 >> 0x1f),uVar24,uVar23);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x3143d8)
            ;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_a0.field_2._M_allocated_capacity = *psVar15;
              local_a0.field_2._8_8_ = plVar10[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar15;
              local_a0._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_a0._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
            paVar1 = &local_e8.field_2;
            puVar14 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_e8.field_2._M_allocated_capacity = *puVar14;
              local_e8.field_2._8_8_ = puVar12[3];
              local_e8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar14;
              local_e8._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_e8._M_string_length = puVar12[1];
            *puVar12 = puVar14;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            uVar23 = (pSVar7->coefficients_).super_RepeatedPtrFieldBase.current_size_;
            uVar21 = -uVar23;
            if (0 < (int)uVar23) {
              uVar21 = uVar23;
            }
            uVar24 = 1;
            if (9 < uVar21) {
              uVar16 = (ulong)uVar21;
              uVar5 = 4;
              do {
                uVar24 = uVar5;
                uVar13 = (uint)uVar16;
                if (uVar13 < 100) {
                  uVar24 = uVar24 - 2;
                  goto LAB_00298c46;
                }
                if (uVar13 < 1000) {
                  uVar24 = uVar24 - 1;
                  goto LAB_00298c46;
                }
                if (uVar13 < 10000) goto LAB_00298c46;
                uVar16 = uVar16 / 10000;
                uVar5 = uVar24 + 4;
              } while (99999 < uVar13);
              uVar24 = uVar24 + 1;
            }
LAB_00298c46:
            paVar3 = &local_c0.field_2;
            local_c0._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_c0,(char)uVar24 - (char)((int)uVar23 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_c0._M_dataplus._M_p + (uVar23 >> 0x1f),uVar24,uVar21);
            uVar19 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar1) {
              uVar19 = local_e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < local_c0._M_string_length + local_e8._M_string_length) {
              uVar19 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar3) {
                uVar19 = local_c0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar19 < local_c0._M_string_length + local_e8._M_string_length)
              goto LAB_00298cb9;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_c0,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p);
            }
            else {
LAB_00298cb9:
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_e8,(ulong)local_c0._M_dataplus._M_p);
            }
            local_110 = (undefined1  [8])local_100;
            puVar14 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_100._0_8_ = *puVar14;
              local_100._8_8_ = puVar12[3];
            }
            else {
              local_100._0_8_ = *puVar14;
              local_110 = (undefined1  [8])*puVar12;
            }
            local_108._M_p = (pointer)puVar12[1];
            *puVar12 = puVar14;
            puVar12[1] = 0;
            *(undefined1 *)puVar14 = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
            if (local_110 != (undefined1  [8])local_100) {
              operator_delete((void *)local_110,local_100._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar3) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar1) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            _Var20._M_p = local_58._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00298e67;
          }
        }
LAB_002991bd:
        operator_delete(_Var20._M_p,local_58.field_2._M_allocated_capacity + 1);
        goto LAB_00298e67;
      }
    }
  }
LAB_00298e07:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_80;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p == &local_68) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_68._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_78._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
LAB_00298e67:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_supportVectorClassifier>(const Specification::Model& format) {

        const Specification::ModelDescription& description = format.description();

        Result result;

        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(description.input());
        if (!result.good()) {
            return result;
        }

        // Check has a classifier interface
        result = validateClassifierInterface(format, format.supportvectorclassifier());
        if (!result.good()) {
            return result;
        }

        // Validate the params
        const Specification::SupportVectorClassifier& svmSpec = format.supportvectorclassifier();

        result = validateKernel(svmSpec.kernel());
        if (!result.good()) {
            return result;
        }

        // Validate number of coefficients and support vectors are consistent
        int K;
        switch (svmSpec.ClassLabels_case()) {
            case Specification::SupportVectorClassifier::kInt64ClassLabels:
                K = svmSpec.int64classlabels().vector_size();
                break;
            case Specification::SupportVectorClassifier::kStringClassLabels:
                K = svmSpec.stringclasslabels().vector_size();
                break;
            case Specification::SupportVectorClassifier::CLASSLABELS_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Int64 class labels must be supplied for SVM classifier.");
        }

        if (svmSpec.coefficients_size() != K-1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "coefficient array must be size numberOfClasses - 1 (" +
                                              std::to_string(K-1) +
                                              "). Instead it is size " +
                                              std::to_string(svmSpec.coefficients_size()));
        }

        int totalSVs = 0;
        switch (svmSpec.supportVectors_case()) {
            case Specification::SupportVectorClassifier::kSparseSupportVectors:
                totalSVs = svmSpec.sparsesupportvectors().vectors_size();
                break;
            case Specification::SupportVectorClassifier::kDenseSupportVectors:
                totalSVs = svmSpec.densesupportvectors().vectors_size();
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Must specify sparse or dense support vectors");
        }

        if(svmSpec.numberofsupportvectorsperclass_size() != K) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "numberOfSupportVectoresPerClass array must be size numberOfClasses " + std::to_string(K) + " instead it is size "
                            +   std::to_string(svmSpec.numberofsupportvectorsperclass_size()));
        }

        int perClassSum = 0;
        for (int c=0; c<K; c++) {
            perClassSum += svmSpec.numberofsupportvectorsperclass(c);
        }

        if (totalSVs != perClassSum) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,

                        "sum of numberOfSupportVectorsPerClass "
                          + std::to_string(perClassSum)
                          + " must sum to total number of support vectors "
                          + std::to_string(totalSVs));
        }

        for (int c=0; c<K-1; c++) {
            if (svmSpec.coefficients(c).alpha_size() != totalSVs) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Incorrect number of coefficients: There should be " +
                                                  std::to_string(totalSVs) +
                                                  " not " +
                                                  std::to_string(svmSpec.coefficients(c).alpha_size()));
            }
        }

        // Validate probA and probB, if given
        if(svmSpec.proba_size() != 0 || svmSpec.probb_size() != 0) {
            int expected_length = K * (K-1) / 2;      // Number of class pairs
            if(svmSpec.proba_size() != svmSpec.probb_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "probA and probB must be same size");
            } else if (svmSpec.proba_size() != expected_length) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Expected length of probA is number of class pairs: " + std::to_string(expected_length));
            }
        }

        return result;
    }